

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O3

void __thiscall FListMenuItemPlayerDisplay::Drawer(FListMenuItemPlayerDisplay *this,bool selected)

{
  FState *pFVar1;
  BYTE *pBVar2;
  FTexture *img;
  bool bVar3;
  FTextureID FVar4;
  char *in_RAX;
  long lVar5;
  long lVar6;
  DVector2 *pDVar7;
  ulong uVar8;
  double *pdVar9;
  FRemapTable *pFVar10;
  int iVar11;
  int iVar12;
  int left;
  FString portrait;
  
  portrait.Chars = in_RAX;
  if ((this->mMode == '\0') && (bVar3 = UpdatePlayerClass(this), !bVar3)) {
    return;
  }
  FString::AttachToOther(&portrait,&this->mPlayerClass->Type->Portrait);
  if ((((*(int *)(portrait.Chars + -0xc) == 0) || (this->mNoportrait != false)) ||
      (FVar4 = FTextureManager::CheckForTexture(&TexMan,portrait.Chars,8,1), FVar4.texnum < 1)) ||
     ((TexMan.Textures.Count <= (uint)FVar4.texnum ||
      (TexMan.Textures.Array[TexMan.Translation.Array[(uint)FVar4.texnum]].Texture ==
       (FTexture *)0x0)))) {
    left = ((screen->super_DSimpleCanvas).super_DCanvas.Width >> 1) +
           ((this->super_FListMenuItem).mXpos + -0xa0) * CleanXfac;
    iVar11 = ((this->super_FListMenuItem).mYpos + -100) * CleanYfac;
    iVar12 = (screen->super_DSimpleCanvas).super_DCanvas.Height >> 1;
    DCanvas::DrawTexture
              ((DCanvas *)screen,this->mBackdrop,(double)left,(double)(iVar12 + iVar11 + -1),
               0x40001389,(ulong)(uint)(CleanXfac * 0x48),0x4000138a,(ulong)(uint)(CleanYfac * 0x50)
               ,0x4000138e,&this->mRemap,0x400013a5,1,0);
    iVar12 = iVar12 + iVar11;
    V_DrawFrame(left,iVar12,CleanXfac * 0x48,CleanYfac * 0x50 + -1);
    pFVar1 = this->mPlayerState;
    if (pFVar1 != (FState *)0x0) {
      lVar6 = (long)this->mSkin;
      if (lVar6 == 0) {
        lVar5 = (long)&((spriteframe_t *)((SpriteFrames.Array)->Texture + -2))->Voxel +
                (ulong)((uint)sprites.Array[pFVar1->sprite].spriteframes * 0x50) +
                (ulong)((uint)pFVar1->Frame * 0x50);
        pBVar2 = (this->mPlayerClass->Type->super_PClassActor).super_PClass.Defaults;
        pDVar7 = (DVector2 *)(pBVar2 + 0xf8);
        pdVar9 = (double *)(pBVar2 + 0x100);
      }
      else {
        pDVar7 = &skins[lVar6].Scale;
        lVar5 = (long)&((spriteframe_t *)((SpriteFrames.Array)->Texture + -2))->Voxel +
                (ulong)((uint)sprites.Array[skins[lVar6].sprite].spriteframes * 0x50) +
                (ulong)((uint)pFVar1->Frame * 0x50);
        pdVar9 = &skins[lVar6].Scale.Y;
      }
      if (lVar5 != 0) {
        uVar8 = (ulong)*(int *)(lVar5 + 8 + (ulong)this->mRotation * 4);
        if (((uVar8 < TexMan.Textures.Count) &&
            (img = TexMan.Textures.Array[TexMan.Translation.Array[uVar8]].Texture,
            img != (FTexture *)0x0)) && (img->UseType != '\r')) {
          if (this->mTranslate == '\0') {
            pFVar10 = (FRemapTable *)0x0;
          }
          else {
            pFVar10 = translationtables[1].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[8].Ptr;
          }
          DCanvas::DrawTexture
                    ((DCanvas *)screen,img,(double)(left + CleanXfac * 0x24),
                     (double)(CleanYfac * 0x47 + iVar12),0x400013af,
                     (pDVar7->X * (double)CleanXfac * (double)img->Width) / (img->Scale).X,
                     (*pdVar9 * (double)CleanYfac * (double)img->Height) / (img->Scale).Y,0x400013b0
                     ,0x4000138e,pFVar10,0x40001395,
                     (ulong)(1 << (this->mRotation & 0x1f) & (uint)*(ushort *)(lVar5 + 0x48)),0);
        }
      }
    }
  }
  else {
    DCanvas::DrawTexture
              ((DCanvas *)screen,
               TexMan.Textures.Array[TexMan.Translation.Array[(uint)FVar4.texnum]].Texture,
               (double)(this->super_FListMenuItem).mXpos,(double)(this->super_FListMenuItem).mYpos,
               0x40001390,1,0);
  }
  FString::~FString(&portrait);
  return;
}

Assistant:

void FListMenuItemPlayerDisplay::Drawer(bool selected)
{
	if (mMode == 0 && !UpdatePlayerClass())
	{
		return;
	}

	FString portrait = mPlayerClass->Type->Portrait;

	if (portrait.IsNotEmpty() && !mNoportrait)
	{
		FTextureID texid = TexMan.CheckForTexture(portrait, FTexture::TEX_MiscPatch);
		if (texid.isValid())
		{
			FTexture *tex = TexMan(texid);
			if (tex != NULL)
			{
				screen->DrawTexture (tex, mXpos, mYpos, DTA_Clean, true, TAG_DONE);
				return;
			}
		}
	}
	int x = (mXpos - 160) * CleanXfac + (SCREENWIDTH>>1);
	int y = (mYpos - 100) * CleanYfac + (SCREENHEIGHT>>1);

	screen->DrawTexture (mBackdrop, x, y - 1,
		DTA_DestWidth, 72 * CleanXfac,
		DTA_DestHeight, 80 * CleanYfac,
		DTA_Translation, &mRemap,
		DTA_Masked, true,
		TAG_DONE);

	V_DrawFrame (x, y, 72*CleanXfac, 80*CleanYfac-1);

	spriteframe_t *sprframe = NULL;
	DVector2 Scale;

	if (mPlayerState != NULL)
	{
		if (mSkin == 0)
		{
			sprframe = &SpriteFrames[sprites[mPlayerState->sprite].spriteframes + mPlayerState->GetFrame()];
			Scale = GetDefaultByType(mPlayerClass->Type)->Scale;
		}
		else
		{
			sprframe = &SpriteFrames[sprites[skins[mSkin].sprite].spriteframes + mPlayerState->GetFrame()];
			Scale = skins[mSkin].Scale;
		}
	}

	if (sprframe != NULL)
	{
		FTexture *tex = TexMan(sprframe->Texture[mRotation]);
		if (tex != NULL && tex->UseType != FTexture::TEX_Null)
		{
			FRemapTable *trans = NULL;
			if (mTranslate) trans = translationtables[TRANSLATION_Players](MAXPLAYERS);
			screen->DrawTexture (tex,
				x + 36*CleanXfac, y + 71*CleanYfac,
				DTA_DestWidthF, tex->GetScaledWidthDouble() * CleanXfac * Scale.X,
				DTA_DestHeightF, tex->GetScaledHeightDouble() * CleanYfac * Scale.Y,
				DTA_Translation, trans,
				DTA_FlipX, sprframe->Flip & (1 << mRotation),
				TAG_DONE);
		}
	}
}